

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>
::fastAccessDx(FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>
               *this,int i)

{
  double dVar1;
  FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *pFVar2;
  FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *pFVar3;
  Fad<double> *pFVar4;
  Fad<double> *pFVar5;
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
  *pFVar6;
  Fad<double> *pFVar7;
  Fad<double> *pFVar8;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar9;
  Fad<double> *pFVar10;
  double dVar11;
  double dVar12;
  
  pFVar2 = (this->left_->fadexpr_).left_;
  pFVar3 = (this->left_->fadexpr_).right_;
  pFVar4 = (pFVar2->fadexpr_).right_;
  pFVar5 = (pFVar3->fadexpr_).right_;
  dVar12 = (pFVar3->fadexpr_).left_.constant_ + pFVar5->val_;
  dVar11 = (pFVar2->fadexpr_).left_.constant_ + pFVar4->val_;
  pFVar6 = (this->right_->fadexpr_).left_;
  pFVar2 = (pFVar6->fadexpr_).left_;
  pFVar7 = (pFVar6->fadexpr_).right_;
  pFVar8 = (pFVar2->fadexpr_).right_;
  pFVar9 = (this->right_->fadexpr_).right_;
  dVar1 = (pFVar9->fadexpr_).left_.constant_;
  pFVar10 = (pFVar9->fadexpr_).right_;
  return dVar11 * dVar12 *
         (dVar1 * (pFVar10->dx_).ptr_to_data[i] +
         ((pFVar8->dx_).ptr_to_data[i] - (pFVar7->dx_).ptr_to_data[i])) +
         (pFVar10->val_ * dVar1 +
         (((pFVar2->fadexpr_).left_.constant_ + pFVar8->val_) - pFVar7->val_)) *
         ((pFVar4->dx_).ptr_to_data[i] * dVar12 + (pFVar5->dx_).ptr_to_data[i] * dVar11);
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) * right_.val() + right_.fastAccessDx(i) * left_.val();}